

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall
QWidgetPrivate::drawWidget
          (QWidgetPrivate *this,QPaintDevice *pdev,QRegion *rgn,QPoint *offset,DrawWidgetFlags flags
          ,QPainter *sharedPainter,QWidgetRepaintManager *repaintManager)

{
  uint uVar1;
  long lVar2;
  QWidget *widget;
  QGraphicsEffectSourcePrivate *this_00;
  QWidgetData *pQVar3;
  qreal qVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  QTextStream *this_01;
  QRegion QVar12;
  char cVar13;
  QFlagsStorage<QWidgetPrivate::DrawWidgetFlag> QVar16;
  int iVar17;
  QWidgetPrivate *d;
  bool bVar14;
  bool bVar15;
  long *plVar18;
  QPalette *pQVar19;
  QBrush *pQVar20;
  QPoint QVar21;
  QPaintEngine *pQVar22;
  QTransform *this_02;
  undefined8 *puVar23;
  long *plVar24;
  byte bVar25;
  QFlagsStorage<QWidgetPrivate::DrawWidgetFlag> flags_00;
  long lVar26;
  undefined8 *puVar27;
  undefined8 *puVar28;
  QWidgetPrivate *pQVar29;
  long in_FS_OFFSET;
  QRect QVar30;
  undefined1 auVar31 [16];
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QPoint local_e0;
  QPoint local_d8;
  QBrush bg;
  undefined1 local_c8 [8];
  QPainter p;
  QPoint local_b8;
  QRegion toBePainted;
  QDebug local_a8;
  QDebug local_a0;
  undefined1 local_98 [32];
  QWidgetPaintContext context;
  
  bVar25 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  cVar13 = QRegion::isEmpty();
  if (cVar13 != '\0') goto LAB_002fcc05;
  widget = *(QWidget **)&this->field_0x8;
  QtPrivateLogging::lcWidgetPainting();
  if (((byte)QtPrivateLogging::lcWidgetPainting::category.field_2.bools.enabledInfo._q_value._M_base
             ._M_i & 1) != 0) {
    context.pdev._0_4_ = 2;
    context.pdev._4_4_ = 0;
    context.rgn.d._0_4_ = 0;
    context.rgn.d._4_4_ = 0;
    context.offset.xp.m_i = 0;
    context.offset.yp.m_i = 0;
    context._24_8_ = QtPrivateLogging::lcWidgetPainting::category.name;
    QMessageLogger::info();
    QVar21 = local_e0;
    QVar32.m_data = (storage_type *)0x7;
    QVar32.m_size = (qsizetype)local_98;
    QString::fromUtf8(QVar32);
    QTextStream::operator<<((QTextStream *)QVar21,(QString *)local_98);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    if (*(QTextStream *)((long)local_e0 + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_e0,' ');
    }
    local_d8 = local_e0;
    *(int *)((long)local_e0 + 0x28) = *(int *)((long)local_e0 + 0x28) + 1;
    ::operator<<((Stream *)&bg,(QRegion *)&local_d8);
    this_01 = _bg;
    QVar33.m_data = (storage_type *)0x2;
    QVar33.m_size = (qsizetype)local_98;
    QString::fromUtf8(QVar33);
    QTextStream::operator<<(this_01,(QString *)local_98);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    if (_bg[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(_bg,' ');
    }
    local_c8 = (undefined1  [8])_bg;
    *(int *)(_bg + 0x28) = *(int *)(_bg + 0x28) + 1;
    ::operator<<((Stream *)&p,(QWidget *)local_c8);
    QVar21 = _p;
    QVar34.m_data = (storage_type *)0x2;
    QVar34.m_size = (qsizetype)local_98;
    QString::fromUtf8(QVar34);
    QTextStream::operator<<((QTextStream *)QVar21,(QString *)local_98);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    if (*(QTextStream *)((long)_p + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)_p,' ');
    }
    local_b8 = _p;
    *(int *)((long)_p + 0x28) = *(int *)((long)_p + 0x28) + 1;
    ::operator<<((Stream *)&toBePainted,&local_b8);
    QVar12 = toBePainted;
    QVar35.m_data = (storage_type *)0x11;
    QVar35.m_size = (qsizetype)local_98;
    QString::fromUtf8(QVar35);
    QTextStream::operator<<((QTextStream *)QVar12.d,(QString *)local_98);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    if (toBePainted.d[0x30] == (QRegionData)0x1) {
      QTextStream::operator<<((QTextStream *)toBePainted.d,' ');
    }
    QTextStream::operator<<((QTextStream *)toBePainted.d,pdev);
    if (toBePainted.d[0x30] == (QRegionData)0x1) {
      QTextStream::operator<<((QTextStream *)toBePainted.d,' ');
    }
    QVar12.d = toBePainted.d;
    QVar36.m_data = (storage_type *)0x4;
    QVar36.m_size = (qsizetype)local_98;
    QString::fromUtf8(QVar36);
    QTextStream::operator<<((QTextStream *)QVar12.d,(QString *)local_98);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    if (toBePainted.d[0x30] == (QRegionData)0x1) {
      QTextStream::operator<<((QTextStream *)toBePainted.d,' ');
    }
    local_a8.stream = (Stream *)toBePainted.d;
    *(int *)(toBePainted.d + 0x28) = *(int *)(toBePainted.d + 0x28) + 1;
    qt_QMetaEnum_flagDebugOperator
              (&local_a0,(ulonglong)&local_a8,
               (QMetaObject *)
               (ulong)(uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                            super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i,
               (char *)&staticMetaObject);
    QDebug::~QDebug(&local_a0);
    QDebug::~QDebug(&local_a8);
    QDebug::~QDebug((QDebug *)&toBePainted);
    QDebug::~QDebug((QDebug *)&local_b8);
    QDebug::~QDebug((QDebug *)&p);
    QDebug::~QDebug((QDebug *)local_c8);
    QDebug::~QDebug((QDebug *)&bg);
    QDebug::~QDebug((QDebug *)&local_d8);
    QDebug::~QDebug((QDebug *)&local_e0);
  }
  bVar14 = shouldPaintOnScreen(this);
  if (this->graphicsEffect == (QGraphicsEffect *)0x0) {
LAB_002fc5f7:
    toBePainted.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&toBePainted,rgn);
    if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 9) == 1) {
      QVar30 = clipRect(this);
      context.pdev._0_4_ = QVar30.x1.m_i;
      context.pdev._4_4_ = QVar30.y1.m_i;
      context.rgn.d._0_4_ = QVar30.x2.m_i;
      context.rgn.d._4_4_ = QVar30.y2.m_i;
      QRegion::operator&=(&toBePainted,(QRect *)&context);
    }
    if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 0x10) == 0) {
      pQVar3 = widget->data;
      context.rgn.d._0_4_ = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
      context.rgn.d._4_4_ = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
      context.pdev._0_4_ = 0;
      context.pdev._4_4_ = 0;
      subtractOpaqueChildren(this,&toBePainted,(QRect *)&context);
    }
    cVar13 = QRegion::isEmpty();
    if (cVar13 == '\0') {
      if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                 super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 2) == 0 && bVar14) {
        if (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
          plVar18 = (long *)(**(code **)(*(long *)pdev + 0x18))();
          if (plVar18 != (long *)0x0) {
            _p = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            QPainter::QPainter(&p,pdev);
            QPainter::setClipRegion((QRegion *)&p,(ClipOperation)&toBePainted);
            _bg = (QTextStream *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar19 = QWidget::palette(widget);
            pQVar20 = (QBrush *)QPalette::brush((ColorGroup)pQVar19,Dark);
            QBrush::QBrush(&bg,pQVar20);
            if (*(int *)(_bg + 4) == 0x18) {
              pQVar3 = widget->data;
              auVar10._4_4_ = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
              auVar10._0_4_ = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
              auVar10._8_8_ = 0;
              local_98._0_16_ = auVar10 << 0x40;
              QBrush::texture();
              local_e0.xp.m_i = 0;
              local_e0.yp.m_i = 0;
              QPainter::drawTiledPixmap(&p,(QRect *)local_98,(QPixmap *)&context,&local_e0);
              QPixmap::~QPixmap((QPixmap *)&context);
            }
            else {
              pQVar3 = widget->data;
              context.rgn.d._0_4_ = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
              context.rgn.d._4_4_ = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
              context.pdev._0_4_ = 0;
              context.pdev._4_4_ = 0;
              QPainter::fillRect((QRect *)&p,(QBrush *)&context);
            }
            if ((*(byte *)((long)plVar18 + 0x14) & 2) != 0) {
              (**(code **)(*plVar18 + 8))();
            }
            QBrush::~QBrush(&bg);
            QPainter::~QPainter(&p);
          }
        }
      }
      else {
        if ((*(byte *)(*(long *)&widget->field_0x8 + 0x243) & 0x40) != 0) {
          drawWidget();
        }
        uVar1 = *(uint *)(*(long *)&widget->field_0x8 + 0x240);
        if ((uVar1 >> 0x1e & 1) == 0) {
          *(uint *)(*(long *)&widget->field_0x8 + 0x240) = uVar1 | 0x40000000;
        }
        plVar18 = (long *)(**(code **)(*(long *)pdev + 0x18))();
        if (plVar18 != (long *)0x0) {
          QVar21.yp.m_i = -(offset->yp).m_i;
          QVar21.xp.m_i = -(offset->xp).m_i;
          this->redirectDev = pdev;
          this->redirectOffset = QVar21;
          if (sharedPainter == (QPainter *)0x0) {
            pQVar3 = widget->data;
            lVar26 = plVar18[3];
            iVar17 = (pQVar3->crect).y1.m_i;
            iVar6 = (pQVar3->crect).x2.m_i;
            iVar7 = (pQVar3->crect).y2.m_i;
            *(int *)(lVar26 + 0x28) = (pQVar3->crect).x1.m_i;
            *(int *)(lVar26 + 0x2c) = iVar17;
            *(int *)(lVar26 + 0x30) = iVar6;
            *(int *)(lVar26 + 0x34) = iVar7;
          }
          else {
            pQVar22 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))(pdev);
            pQVar29 = (QWidgetPrivate *)pdev;
            qVar4 = (qreal)QPaintDevice::devicePixelRatio();
            setSystemClip(pQVar29,pQVar22,qVar4,&toBePainted);
          }
          if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                     super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 1) == 0) {
            lVar26 = *(long *)(*(long *)&widget->field_0x8 + 0x78);
            if (lVar26 == 0) {
              bVar25 = 0;
            }
            else {
              bVar25 = (*(byte *)(lVar26 + 0x7c) & 0x10) >> 4;
            }
            if ((bVar25 != 0 || bVar14) ||
               ((*(byte *)(*(long *)&widget->field_0x8 + 0x247) & 0x20) != 0)) goto LAB_002fccad;
          }
          else {
LAB_002fccad:
            if ((widget->data->widget_attributes & 0x210) == 0) {
              (**(code **)(*(long *)this + 0x60))(this);
              context.pdev._0_4_ = -0x55555556;
              context.pdev._4_4_ = -0x55555556;
              QPainter::QPainter((QPainter *)&context,&widget->super_QPaintDevice);
              QPainter::setRenderHint((RenderHint)&context,true);
              QVar16.i = (uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 0xfffffefe |
                         1;
              flags_00.i = 0;
              if (bVar14) {
                flags_00.i = QVar16.i;
              }
              if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                         super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 1) != 0) {
                flags_00.i = QVar16.i;
              }
              paintBackground(this,(QPainter *)&context,&toBePainted,(DrawWidgetFlags)flags_00.i);
              (**(code **)(*(long *)this + 0x68))(this);
              QPainter::~QPainter((QPainter *)&context);
            }
          }
          if (sharedPainter == (QPainter *)0x0) {
            pQVar22 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))(pdev);
            qVar4 = (qreal)QPaintDevice::devicePixelRatio();
            pQVar29 = (QWidgetPrivate *)&context;
            QRegion::translated((int)(QWidgetPrivate *)&context,(int)&toBePainted);
            setSystemClip(pQVar29,pQVar22,qVar4,(QRegion *)&context);
            QRegion::~QRegion((QRegion *)&context);
          }
          if (((!bVar14 &&
                ((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                       super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 1) == 0) &&
              ((this->field_0x252 & 2) == 0)) &&
             ((*(byte *)(*(long *)&widget->field_0x8 + 0x246) & 4) != 0)) {
            (**(code **)(*(long *)this + 0x60))(this);
            _p = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            QPainter::QPainter(&p,&widget->super_QPaintDevice);
            context.pdev._0_4_ = 0xaaaaaaaa;
            context.pdev._4_4_ = 0xaaaaaaaa;
            context.rgn.d._0_4_ = 0xaaaaaaaa;
            context.rgn.d._4_4_ = 0xaaaaaaaa;
            pQVar19 = QWidget::palette(widget);
            plVar24 = (long *)QPalette::brush((ColorGroup)pQVar19,Dark);
            uVar8 = *(undefined8 *)(*plVar24 + 8);
            uVar9 = *(undefined8 *)(*plVar24 + 0x10);
            context.pdev._0_4_ = (int)uVar8;
            context.pdev._4_4_ = (int)((ulong)uVar8 >> 0x20);
            context.rgn.d._0_4_ = (int)uVar9;
            context.rgn.d._4_4_ = (int)((ulong)uVar9 >> 0x20);
            QColor::setAlphaF(0.6);
            local_98._0_16_ = QRegion::boundingRect();
            QPainter::fillRect((QRect *)&p,(QColor *)local_98);
            (**(code **)(*(long *)this + 0x68))(this);
            QPainter::~QPainter(&p);
          }
        }
        if ((this->field_0x253 & 1) == 0) {
LAB_002fce8a:
          sendPaintEvent(this,&toBePainted);
        }
        else {
          (**(code **)(*(long *)this + 0x60))(this);
          if ((repaintManager == (QWidgetRepaintManager *)0x0) ||
             ((*(uint *)(*(long *)&widget->field_0x8 + 0x24c) & 1) != 0)) {
            if (repaintManager != (QWidgetRepaintManager *)0x0) goto LAB_002fcf62;
            context.offset.xp.m_i = -0x55555556;
            context.offset.yp.m_i = -0x55555556;
            context.pdev._0_4_ = -0x55555556;
            context.pdev._4_4_ = -0x55555556;
            context.rgn.d._0_4_ = -0x55555556;
            context.rgn.d._4_4_ = -0x55555556;
            (**(code **)(*(long *)this + 0x58))(&context,this);
            iVar17 = QImage::format();
            if (iVar17 == 4) {
              QImage::reinterpretAsFormat((Format)&context);
            }
            _p = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            QPainter::QPainter(&p,&widget->super_QPaintDevice);
            pQVar3 = widget->data;
            auVar31._4_4_ = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
            auVar31._0_4_ = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
            auVar31._8_8_ = 0;
            local_98._0_16_ = auVar31 << 0x40;
            QPainter::drawImage(&p,(QRect *)local_98,(QImage *)&context);
            QPainter::~QPainter(&p);
            QImage::~QImage((QImage *)&context);
            bVar14 = true;
          }
          else {
            _p = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            QPainter::QPainter(&p,&widget->super_QPaintDevice);
            QPainter::setCompositionMode((CompositionMode)(QRect *)&p);
            pQVar3 = widget->data;
            auVar11._4_4_ = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
            auVar11._0_4_ = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
            auVar11._8_8_ = 0;
            local_98._0_16_ = auVar11 << 0x40;
            QColor::QColor((QColor *)&context,transparent);
            QPainter::fillRect((QRect *)&p,(QColor *)local_98);
            QPainter::~QPainter(&p);
LAB_002fcf62:
            bVar14 = false;
          }
          (**(code **)(*(long *)this + 0x68))(this);
          if (((*(uint *)&this->field_0x250 >> 0x1b & 1) != 0) &&
             (*(uint *)&this->field_0x250 = *(uint *)&this->field_0x250 & 0xf7ffffff, !bVar14))
          goto LAB_002fce8a;
        }
        if (repaintManager != (QWidgetRepaintManager *)0x0) {
          QWidgetRepaintManager::markNeedsFlush
                    ((QWidgetRepaintManager *)repaintManager,widget,&toBePainted,offset);
        }
        if (plVar18 != (long *)0x0) {
          this->redirectDev = (QPaintDevice *)0x0;
          lVar26 = plVar18[3];
          if (sharedPainter == (QPainter *)0x0) {
            *(undefined4 *)(lVar26 + 0x28) = 0;
            *(undefined4 *)(lVar26 + 0x2c) = 0;
            *(undefined4 *)(lVar26 + 0x30) = 0xffffffff;
            *(undefined4 *)(lVar26 + 0x34) = 0xffffffff;
          }
          else {
            *(undefined8 *)(lVar26 + 0x90) = 0;
          }
          pQVar22 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))();
          pQVar29 = (QWidgetPrivate *)&context;
          QRegion::QRegion((QRegion *)&context);
          setSystemClip(pQVar29,pQVar22,1.0,(QRegion *)&context);
          QRegion::~QRegion((QRegion *)&context);
        }
        uVar1 = *(uint *)(*(long *)&widget->field_0x8 + 0x240);
        if ((uVar1 >> 0x1e & 1) != 0) {
          *(uint *)(*(long *)&widget->field_0x8 + 0x240) = uVar1 & 0xbfffffff;
        }
        if (*(short *)&widget->field_0x18 != 0) {
          drawWidget();
        }
        if ((plVar18 != (long *)0x0) && ((*(byte *)((long)plVar18 + 0x14) & 2) != 0)) {
          (**(code **)(*plVar18 + 8))(plVar18);
        }
      }
    }
    context.pdev = (QPaintDevice *)CONCAT44(context.pdev._4_4_,context.pdev._0_4_);
    if ((((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 4) != 0) &&
       (context.pdev = (QPaintDevice *)CONCAT44(context.pdev._4_4_,context.pdev._0_4_),
       *(long *)&this->field_0x28 != 0)) {
      paintSiblingsRecursive
                (this,pdev,(QObjectList *)&this->field_0x18,(int)*(long *)&this->field_0x28 + -1,rgn
                 ,offset,(DrawWidgetFlags)
                         ((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                                super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 0xfffffefe),
                 sharedPainter,repaintManager);
    }
  }
  else {
    bVar15 = QGraphicsEffect::isEnabled(this->graphicsEffect);
    if ((!bVar15) ||
       (this_00 = *(QGraphicsEffectSourcePrivate **)
                   (*(long *)(*(long *)&this->graphicsEffect->field_0x8 + 0x78) + 8),
       *(long *)&this_00[1].field_0x8 != 0)) goto LAB_002fc5f7;
    toBePainted.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i >> 8 & 1) == 0) {
      QRegion::QRegion(&toBePainted,rgn);
    }
    else {
      auVar31 = QRegion::boundingRect();
      context.pdev._0_4_ = auVar31._0_4_;
      context.pdev._4_4_ = auVar31._4_4_;
      context.rgn.d._0_4_ = auVar31._8_4_;
      context.rgn.d._4_4_ = auVar31._12_4_;
      QRegion::QRegion(&toBePainted,(QRect *)&context,Rectangle);
    }
    context.rgn.d._0_4_ = -0x55555556;
    context.rgn.d._4_4_ = -0x55555556;
    context.painter = (QPainter *)&DAT_aaaaaaaaaaaaaaaa;
    context.sharedPainter = (QPainter *)&DAT_aaaaaaaaaaaaaaaa;
    context.repaintManager = (QWidgetRepaintManager *)&DAT_aaaaaaaaaaaaaaaa;
    context.offset.xp.m_i = -0x55555556;
    context.offset.yp.m_i = -0x55555556;
    context._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    context.pdev = pdev;
    QRegion::QRegion(&context.rgn,&toBePainted);
    context.offset.xp = (*offset).xp;
    context.offset.yp = (*offset).yp;
    context.flags =
         (DrawWidgetFlags)
         (DrawWidgetFlags)
         flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
         super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i;
    context.repaintManager = repaintManager;
    context.painter = (QPainter *)0x0;
    *(QWidgetPaintContext **)&this_00[1].field_0x8 = &context;
    context.sharedPainter = sharedPainter;
    if (sharedPainter == (QPainter *)0x0) {
      pQVar22 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))(pdev);
      qVar4 = (qreal)QPaintDevice::devicePixelRatio();
      pQVar29 = (QWidgetPrivate *)local_98;
      QRegion::translated((int)(QWidgetPrivate *)local_98,(int)&toBePainted);
      setSystemClip(pQVar29,pQVar22,qVar4,(QRegion *)local_98);
      QRegion::~QRegion((QRegion *)local_98);
      _p = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter(&p,pdev);
      dVar5 = (double)(*offset).yp.m_i;
      local_98._8_4_ = SUB84(dVar5,0);
      local_98._0_8_ = (double)(*offset).xp.m_i;
      local_98._12_4_ = (int)((ulong)dVar5 >> 0x20);
      QPainter::translate((QPointF *)&p);
      context.painter = &p;
      (**(code **)(*(long *)this->graphicsEffect + 0x68))(this->graphicsEffect,(QPointF *)&p);
      pQVar22 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))(pdev);
      pQVar29 = (QWidgetPrivate *)local_98;
      QRegion::QRegion((QRegion *)local_98);
      setSystemClip(pQVar29,pQVar22,1.0,(QRegion *)local_98);
      QRegion::~QRegion((QRegion *)local_98);
      QPainter::~QPainter(&p);
    }
    else {
      context.painter = sharedPainter;
      this_02 = (QTransform *)QPainter::worldTransform();
      cVar13 = QTransform::operator!=(this_02,(QTransform *)&this_00[1].field_0x10);
      if (cVar13 != '\0') {
        QGraphicsEffectSourcePrivate::invalidateCache(this_00,SourceChanged);
        puVar23 = (undefined8 *)QPainter::worldTransform();
        puVar27 = puVar23;
        puVar28 = (undefined8 *)&this_00[1].field_0x10;
        for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
          *puVar28 = *puVar27;
          puVar27 = puVar27 + (ulong)bVar25 * -2 + 1;
          puVar28 = puVar28 + (ulong)bVar25 * -2 + 1;
        }
        *(undefined2 *)&this_00[1].field_0x58 = *(undefined2 *)(puVar23 + 9);
      }
      QPainter::save();
      dVar5 = (double)(*offset).yp.m_i;
      local_98._8_4_ = SUB84(dVar5,0);
      local_98._0_8_ = (double)(*offset).xp.m_i;
      local_98._12_4_ = (int)((ulong)dVar5 >> 0x20);
      QPainter::translate((QPointF *)sharedPainter);
      pQVar22 = (QPaintEngine *)QPainter::paintEngine();
      QPainter::device();
      qVar4 = (qreal)QPaintDevice::devicePixelRatio();
      pQVar29 = (QWidgetPrivate *)local_98;
      QRegion::translated((int)(QWidgetPrivate *)local_98,(int)&toBePainted);
      setSystemClip(pQVar29,pQVar22,qVar4,(QRegion *)local_98);
      QRegion::~QRegion((QRegion *)local_98);
      (**(code **)(*(long *)this->graphicsEffect + 0x68))(this->graphicsEffect,sharedPainter);
      pQVar22 = (QPaintEngine *)QPainter::paintEngine();
      pQVar29 = (QWidgetPrivate *)local_98;
      QRegion::QRegion((QRegion *)local_98);
      setSystemClip(pQVar29,pQVar22,1.0,(QRegion *)local_98);
      QRegion::~QRegion((QRegion *)local_98);
      QPainter::restore();
    }
    *(undefined8 *)&this_00[1].field_0x8 = 0;
    if (repaintManager != (QWidgetRepaintManager *)0x0) {
      QWidgetRepaintManager::markNeedsFlush
                ((QWidgetRepaintManager *)repaintManager,widget,&toBePainted,offset);
    }
    QRegion::~QRegion(&context.rgn);
  }
  QRegion::~QRegion(&toBePainted);
LAB_002fcc05:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::drawWidget(QPaintDevice *pdev, const QRegion &rgn, const QPoint &offset, DrawWidgetFlags flags,
                                QPainter *sharedPainter, QWidgetRepaintManager *repaintManager)
{
    if (rgn.isEmpty())
        return;

    Q_Q(QWidget);

    qCInfo(lcWidgetPainting) << "Drawing" << rgn << "of" << q << "at" << offset
        << "into paint device" << pdev << "with" << flags;

    const bool asRoot = flags & DrawAsRoot;
    bool onScreen = shouldPaintOnScreen();

#if QT_CONFIG(graphicseffect)
    if (graphicsEffect && graphicsEffect->isEnabled()) {
        QGraphicsEffectSource *source = graphicsEffect->d_func()->source;
        QWidgetEffectSourcePrivate *sourced = static_cast<QWidgetEffectSourcePrivate *>
                                                         (source->d_func());
        if (!sourced->context) {
            const QRegion effectRgn((flags & UseEffectRegionBounds) ? rgn.boundingRect() : rgn);
            QWidgetPaintContext context(pdev, effectRgn, offset, flags, sharedPainter, repaintManager);
            sourced->context = &context;
            if (!sharedPainter) {
                setSystemClip(pdev->paintEngine(), pdev->devicePixelRatio(), effectRgn.translated(offset));
                QPainter p(pdev);
                p.translate(offset);
                context.painter = &p;
                graphicsEffect->draw(&p);
                setSystemClip(pdev->paintEngine(), 1, QRegion());
            } else {
                context.painter = sharedPainter;
                if (sharedPainter->worldTransform() != sourced->lastEffectTransform) {
                    sourced->invalidateCache();
                    sourced->lastEffectTransform = sharedPainter->worldTransform();
                }
                sharedPainter->save();
                sharedPainter->translate(offset);
                setSystemClip(sharedPainter->paintEngine(), sharedPainter->device()->devicePixelRatio(), effectRgn.translated(offset));
                graphicsEffect->draw(sharedPainter);
                setSystemClip(sharedPainter->paintEngine(), 1, QRegion());
                sharedPainter->restore();
            }
            sourced->context = nullptr;

            if (repaintManager)
                repaintManager->markNeedsFlush(q, effectRgn, offset);

            return;
        }
    }
#endif // QT_CONFIG(graphicseffect)
    flags = flags & ~UseEffectRegionBounds;

    const bool alsoOnScreen = flags & DrawPaintOnScreen;
    const bool recursive = flags & DrawRecursive;
    const bool alsoInvisible = flags & DrawInvisible;

    Q_ASSERT(sharedPainter ? sharedPainter->isActive() : true);

    QRegion toBePainted(rgn);
    if (asRoot && !alsoInvisible)
        toBePainted &= clipRect(); //(rgn & visibleRegion());
    if (!(flags & DontSubtractOpaqueChildren))
        subtractOpaqueChildren(toBePainted, q->rect());

    if (!toBePainted.isEmpty()) {
        if (!onScreen || alsoOnScreen) {
            //update the "in paint event" flag
            if (Q_UNLIKELY(q->testAttribute(Qt::WA_WState_InPaintEvent)))
                qWarning("QWidget::repaint: Recursive repaint detected");
            q->setAttribute(Qt::WA_WState_InPaintEvent);

            //clip away the new area
            QPaintEngine *paintEngine = pdev->paintEngine();
            if (paintEngine) {
                setRedirected(pdev, -offset);

                if (sharedPainter)
                    setSystemClip(pdev->paintEngine(), pdev->devicePixelRatio(), toBePainted);
                else
                    paintEngine->d_func()->systemRect = q->data->crect;

                //paint the background
                if ((asRoot || q->autoFillBackground() || onScreen || q->testAttribute(Qt::WA_StyledBackground))
                    && !q->testAttribute(Qt::WA_OpaquePaintEvent) && !q->testAttribute(Qt::WA_NoSystemBackground)) {
                    beginBackingStorePainting();
                    QPainter p(q);
                    p.setRenderHint(QPainter::SmoothPixmapTransform);
                    paintBackground(&p, toBePainted, (asRoot || onScreen) ? (flags | DrawAsRoot) : DrawWidgetFlags());
                    endBackingStorePainting();
                }

                if (!sharedPainter)
                    setSystemClip(pdev->paintEngine(), pdev->devicePixelRatio(), toBePainted.translated(offset));

                if (!onScreen && !asRoot && !isOpaque && q->testAttribute(Qt::WA_TintedBackground)) {
                    beginBackingStorePainting();
                    QPainter p(q);
                    QColor tint = q->palette().window().color();
                    tint.setAlphaF(.6f);
                    p.fillRect(toBePainted.boundingRect(), tint);
                    endBackingStorePainting();
                }
            }

#if 0
            qDebug() << "painting" << q << "opaque ==" << isOpaque();
            qDebug() << "clipping to" << toBePainted << "location == " << offset
                     << "geometry ==" << QRect(q->mapTo(q->window(), QPoint(0, 0)), q->size());
#endif

            bool skipPaintEvent = false;
            if (renderToTexture) {
                // This widget renders into a texture which is composed later. We just need to
                // punch a hole in the backingstore, so the texture will be visible.
                beginBackingStorePainting();
                if (!q->testAttribute(Qt::WA_AlwaysStackOnTop) && repaintManager) {
                    QPainter p(q);
                    p.setCompositionMode(QPainter::CompositionMode_Source);
                    p.fillRect(q->rect(), Qt::transparent);
                } else if (!repaintManager) {
                    // We are not drawing to a backingstore: fall back to QImage
                    QImage img = grabFramebuffer();
                    // grabFramebuffer() always sets the format to RGB32
                    // regardless of whether it is transparent or not.
                    if (img.format() == QImage::Format_RGB32)
                        img.reinterpretAsFormat(QImage::Format_ARGB32_Premultiplied);
                    QPainter p(q);
                    p.drawImage(q->rect(), img);
                    skipPaintEvent = true;
                }
                endBackingStorePainting();
                if (renderToTextureReallyDirty)
                    renderToTextureReallyDirty = 0;
                else
                    skipPaintEvent = true;
            }

            if (!skipPaintEvent) {
                //actually send the paint event
                sendPaintEvent(toBePainted);
            }

            if (repaintManager)
                repaintManager->markNeedsFlush(q, toBePainted, offset);

            //restore
            if (paintEngine) {
                restoreRedirected();
                if (!sharedPainter)
                    paintEngine->d_func()->systemRect = QRect();
                else
                    paintEngine->d_func()->currentClipDevice = nullptr;

                setSystemClip(pdev->paintEngine(), 1, QRegion());
            }
            q->setAttribute(Qt::WA_WState_InPaintEvent, false);
            if (Q_UNLIKELY(q->paintingActive()))
                qWarning("QWidget::repaint: It is dangerous to leave painters active on a widget outside of the PaintEvent");

            if (paintEngine && paintEngine->autoDestruct()) {
                delete paintEngine;
            }
        } else if (q->isWindow()) {
            QPaintEngine *engine = pdev->paintEngine();
            if (engine) {
                QPainter p(pdev);
                p.setClipRegion(toBePainted);
                const QBrush bg = q->palette().brush(QPalette::Window);
                if (bg.style() == Qt::TexturePattern)
                    p.drawTiledPixmap(q->rect(), bg.texture());
                else
                    p.fillRect(q->rect(), bg);

                if (engine->autoDestruct())
                    delete engine;
            }
        }
    }

    if (recursive && !children.isEmpty()) {
        paintSiblingsRecursive(pdev, children, children.size() - 1, rgn, offset, flags & ~DrawAsRoot,
                               sharedPainter, repaintManager);
    }
}